

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O0

void * bgflusher_thread(void *voidargs)

{
  avl_node *paVar1;
  err_log_callback *log_callback_00;
  avl_node *__ptr;
  uint64_t uVar2;
  uint uVar3;
  filemgr_open_result fVar4;
  timespec ts;
  filemgr_open_result ffs;
  uint64_t num_blocks;
  err_log_callback *log_callback;
  openfiles_elem *elem;
  filemgr *file;
  avl_node *a;
  fdb_status fs;
  err_log_callback *in_stack_00000338;
  filemgr_config *in_stack_00000340;
  filemgr_ops *in_stack_00000348;
  char *in_stack_00000350;
  err_log_callback *in_stack_000005c0;
  char *in_stack_000005c8;
  undefined1 in_stack_000005d7;
  filemgr *in_stack_000005d8;
  err_log_callback *in_stack_ffffffffffffff80;
  filemgr *in_stack_ffffffffffffff88;
  timespec local_70;
  filemgr *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  filemgr *in_stack_ffffffffffffffb0;
  long local_40;
  avl_node *local_20;
  
  while( true ) {
    local_40 = 0;
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    local_20 = avl_first(&openfiles);
    while (local_20 != (avl_node *)0x0) {
      __ptr = local_20 + -0x36;
      paVar1 = local_20[-0xc].right;
      if (paVar1 == (avl_node *)0x0) {
        local_20 = avl_next(local_20);
        avl_remove((avl_tree *)in_stack_ffffffffffffffb0,
                   (avl_node *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        free(__ptr);
      }
      else if (((ulong)local_20[-1].left & 0x100000000) == 0) {
        *(undefined1 *)((long)&local_20[-1].left + 4) = 1;
        log_callback_00 = (err_log_callback *)local_20[-1].right;
        fVar4 = filemgr_open(in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338
                            );
        in_stack_ffffffffffffffa0 = fVar4.file;
        uVar3 = fVar4.rv;
        in_stack_ffffffffffffffa8 = uVar3;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffa0;
        pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
        if (uVar3 == 0) {
          uVar2 = filemgr_flush_immutable(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          local_40 = uVar2 + local_40;
          filemgr_close(in_stack_000005d8,(bool)in_stack_000005d7,in_stack_000005c8,
                        in_stack_000005c0);
        }
        else {
          in_stack_ffffffffffffff80 = (err_log_callback *)paVar1->parent;
          fdb_log_impl(log_callback_00,2,(fdb_status)(ulong)uVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/bgflusher.cc"
                       ,"bgflusher_thread",0x7f,
                       "Failed to open the file \'%s\' for background flushing\n.");
        }
        pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
        *(undefined1 *)((long)&local_20[-1].left + 4) = 0;
        local_20 = avl_next(local_20);
        if (bgflusher_terminate_signal != '\0') {
          pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
          return (void *)0x0;
        }
      }
      else {
        local_20 = avl_next(local_20);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    if (bgflusher_terminate_signal != '\0') {
      pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
      return (void *)0x0;
    }
    if (local_40 == 0) {
      local_70 = convert_reltime_to_abstime((uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&local_70);
    }
    if (bgflusher_terminate_signal != '\0') break;
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
  return (void *)0x0;
}

Assistant:

static void * bgflusher_thread(void *voidargs)
{
    fdb_status fs;
    struct avl_node *a;
    struct filemgr *file;
    struct openfiles_elem *elem;
    err_log_callback *log_callback = NULL;

    while (1) {
        uint64_t num_blocks = 0;

        mutex_lock(&bgf_lock);
        a = avl_first(&openfiles);
        while(a) {
            filemgr_open_result ffs;
            elem = _get_entry(a, struct openfiles_elem, avl);
            file = elem->file;
            if (!file) {
                a = avl_next(a);
                avl_remove(&openfiles, &elem->avl);
                free(elem);
                continue;
            }

            if (elem->background_flush_in_progress) {
                a = avl_next(a);
            } else {
                elem->background_flush_in_progress = true;
                log_callback = elem->log_callback;
                ffs = filemgr_open(file->filename, file->ops,
                        file->config, log_callback);
                fs = (fdb_status)ffs.rv;
                mutex_unlock(&bgf_lock);
                if (fs == FDB_RESULT_SUCCESS) {
                    num_blocks += filemgr_flush_immutable(file,
                                                          log_callback);
                    filemgr_close(file, 0, file->filename, log_callback);

                } else {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Failed to open the file '%s' for background flushing\n.",
                            file->filename);
                }
                mutex_lock(&bgf_lock);
                elem->background_flush_in_progress = false;
                a = avl_next(&elem->avl);
                if (bgflusher_terminate_signal) {
                    mutex_unlock(&bgf_lock);
                    return NULL;
                }
            }
        }
        mutex_unlock(&bgf_lock);

        mutex_lock(&sync_mutex);
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        if (!num_blocks) {
            thread_cond_timedwait(&sync_cond, &sync_mutex,
                                  (unsigned)(sleep_duration * 1000));
        }
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        mutex_unlock(&sync_mutex);
    }
    return NULL;
}